

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

enable_if_t<_isTupleLikeV<const_mathiu::impl::Product_&>_&&_isRangeV<const_mathiu::impl::Product_&>,_bool>
 matchit::impl::
 PatternTraits<matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>>>
 ::
 matchPatternImpl<mathiu::impl::Product_const*,matchit::impl::Context<mathiu::impl::Sum_const*,bool,bool,mathiu::impl::Product_const*,bool>>
           (Product **value,
           App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
           *appPat,int32_t depth,
           Context<const_mathiu::impl::Sum_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool>
           *context)

{
  enable_if_t<_isTupleLikeV<const_mathiu::impl::Product_&>_&&_isRangeV<const_mathiu::impl::Product_&>,_bool>
  eVar1;
  anon_class_1_0_00000001 *f;
  invoke_result_t<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_const_mathiu::impl::Product_*&>
  value_00;
  InternalPatternT<matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *pattern;
  Context<const_mathiu::impl::Sum_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool> *context_local
  ;
  int32_t depth_local;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
  *appPat_local;
  Product **value_local;
  
  f = App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
      ::unary(appPat);
  value_00 = invoke_<matchit::impl::__1_const&,mathiu::impl::Product_const*&>(f,value);
  pattern = App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Ds<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
            ::pattern(appPat);
  eVar1 = matchPattern<mathiu::impl::Product_const&,matchit::impl::Ds<matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Ds<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<mathiu::impl::Sum_const*,bool,bool,mathiu::impl::Product_const*,bool>>
                    (value_00,pattern,depth + 1,context);
  return eVar1;
}

Assistant:

constexpr static auto matchPatternImpl(Value &&value,
                                                   App<Unary, Pattern> const &appPat,
                                                   int32_t depth, ContextT &context)
            {
                if constexpr (std::is_same_v<AppResultCurTuple<Value>, std::tuple<>>)
                {
                    return matchPattern(
                        std::forward<AppResult<Value>>(invoke_(appPat.unary(), value)),
                        appPat.pattern(), depth + 1, context);
                }
                else
                {
                    context.emplace_back(invoke_(appPat.unary(), value));
                    decltype(auto) result =
                        get<std::decay_t<AppResult<Value>>>(context.back());
                    return matchPattern(std::forward<AppResult<Value>>(result),
                                        appPat.pattern(), depth + 1, context);
                }
            }